

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O2

void pmpcfg_csr_write_riscv32
               (CPURISCVState_conflict *env,uint32_t reg_index,target_ulong_conflict val)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(reg_index << 2);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    if (uVar3 < 0x10) {
      iVar1 = pmp_is_locked(env,(uint32_t)uVar3);
      if (iVar1 == 0) {
        (&(env->pmp_state).pmp[reg_index << 2].cfg_reg)[lVar2] =
             (uint8_t)(val >> ((byte)lVar2 & 0x1f));
        pmp_update_rule(env,(uint32_t)uVar3);
      }
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void pmpcfg_csr_write(CPURISCVState *env, uint32_t reg_index,
    target_ulong val)
{
    int i;
    uint8_t cfg_val;

    if ((reg_index & 1) && (sizeof(target_ulong) == 8)) {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpcfg write - incorrect address\n");
        return;
    }

    for (i = 0; i < sizeof(target_ulong); i++) {
        cfg_val = (val >> 8 * i)  & 0xff;
        pmp_write_cfg(env, (reg_index * sizeof(target_ulong)) + i,
            cfg_val);
    }
}